

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  _func_int *p_Var1;
  pointer pcVar2;
  int iVar3;
  code *pcVar4;
  bool bVar5;
  undefined1 *puVar6;
  LogMessageData *pLVar7;
  int *piVar8;
  time_point now;
  char *pcVar9;
  long *this_00;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  LogStream *pLVar11;
  ostream *poVar12;
  long lVar13;
  LogMessageTime *pLVar14;
  LogMessageTime *pLVar15;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  byte bVar16;
  string stacktrace;
  ios saved_fmt;
  
  bVar16 = 0;
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == FATAL) && (exit_on_dfatal != '\0')) {
    std::mutex::lock((mutex *)fatal_msg_lock);
    if (fatal_msg_exclusive == '\0') {
      fatal_msg_exclusive = '\x01';
      fatal_msg_data_exclusive[0x76e1] = 1;
      puVar6 = fatal_msg_data_exclusive;
    }
    else {
      DAT_0013fbe9 = 0;
      puVar6 = (undefined1 *)&fatal_msg_data_shared;
    }
    this->data_ = (LogMessageData *)puVar6;
    pthread_mutex_unlock((pthread_mutex_t *)fatal_msg_lock);
    pLVar7 = this->data_;
  }
  else {
    lVar13 = *in_FS_OFFSET;
    if (*(char *)(lVar13 + -0x76f0) == '\x01') {
      *(undefined1 *)(lVar13 + -0x76f0) = 0;
      pLVar7 = (LogMessageData *)(lVar13 + -0x76e8);
      LogMessageData::LogMessageData(pLVar7);
    }
    else {
      pLVar7 = (LogMessageData *)operator_new(0x76e8);
      LogMessageData::LogMessageData(pLVar7);
      this->allocated_ = pLVar7;
    }
    this->data_ = pLVar7;
    pLVar7->first_fatal_ = false;
  }
  piVar8 = __errno_location();
  pLVar7->preserved_errno_ = *piVar8;
  pLVar7->severity_ = severity;
  pLVar7->line_ = line;
  pLVar7->send_method_ = send_method;
  *(undefined8 *)&pLVar7->field_0x76a8 = in_R9;
  (pLVar7->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  LogMessageTime::LogMessageTime((LogMessageTime *)&saved_fmt,now);
  pLVar14 = (LogMessageTime *)&saved_fmt;
  pLVar15 = &this->time_;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    iVar3 = (pLVar14->tm_).tm_min;
    (pLVar15->tm_).tm_sec = (pLVar14->tm_).tm_sec;
    (pLVar15->tm_).tm_min = iVar3;
    pLVar14 = (LogMessageTime *)((long)pLVar14 + (ulong)bVar16 * -0x10 + 8);
    pLVar15 = (LogMessageTime *)((long)pLVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  pLVar7 = this->data_;
  pLVar7->num_chars_to_log_ = 0;
  pLVar7->num_chars_to_syslog_ = 0;
  pcVar9 = glog_internal_namespace_::const_basename(file);
  pLVar7 = this->data_;
  pLVar7->basename_ = pcVar9;
  pLVar7->fullname_ = file;
  pLVar7->has_been_flushed_ = false;
  if ((line != -1) && (fLB::FLAGS_log_prefix != '\0')) {
    std::ios::ios(&saved_fmt,(streambuf *)0x0);
    std::ios::copyfmt(&saved_fmt);
    pLVar7 = this->data_;
    p_Var1 = (pLVar7->stream_).super_ostream._vptr_basic_ostream[-3];
    std::ios::fill();
    (p_Var1 + 0xe0)[(long)&(pLVar7->stream_).super_ostream._vptr_basic_ostream] = (code)0x30;
    pcVar4 = (anonymous_namespace)::custom_prefix_callback;
    pLVar7 = this->data_;
    if ((anonymous_namespace)::custom_prefix_callback == (code *)0x0) {
      std::operator<<(&(pLVar7->stream_).super_ostream,
                      **(char **)(LogSeverityNames + (ulong)severity * 8));
      if (fLB::FLAGS_log_year_in_prefix == '\x01') {
        pLVar7 = this->data_;
        *(undefined8 *)
         ((pLVar7->stream_).super_ostream._vptr_basic_ostream[-3] + 0x10 +
         (long)&(pLVar7->stream_).super_ostream._vptr_basic_ostream) = 4;
        std::ostream::operator<<(&pLVar7->stream_,(this->time_).tm_.tm_year + 0x76c);
      }
      pLVar7 = this->data_;
      *(undefined8 *)
       ((pLVar7->stream_).super_ostream._vptr_basic_ostream[-3] + 0x10 +
       (long)&(pLVar7->stream_).super_ostream._vptr_basic_ostream) = 2;
      this_00 = (long *)std::ostream::operator<<(&pLVar7->stream_,(this->time_).tm_.tm_mon + 1);
      *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
      poVar12 = (ostream *)std::ostream::operator<<(this_00,(this->time_).tm_.tm_mday);
      poVar12 = std::operator<<(poVar12,' ');
      *(undefined8 *)(&poVar12->field_0x10 + (long)poVar12->_vptr_basic_ostream[-3]) = 2;
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(this->time_).tm_.tm_hour);
      poVar12 = std::operator<<(poVar12,':');
      *(undefined8 *)(&poVar12->field_0x10 + (long)poVar12->_vptr_basic_ostream[-3]) = 2;
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(this->time_).tm_.tm_min);
      poVar12 = std::operator<<(poVar12,':');
      *(undefined8 *)(&poVar12->field_0x10 + (long)poVar12->_vptr_basic_ostream[-3]) = 2;
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(this->time_).tm_.tm_sec);
      poVar12 = std::operator<<(poVar12,".");
      *(undefined8 *)(&poVar12->field_0x10 + (long)poVar12->_vptr_basic_ostream[-3]) = 6;
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      poVar12 = std::operator<<(poVar12,' ');
      poVar12 = std::operator<<(poVar12,0x20);
      *(undefined8 *)(&poVar12->field_0x10 + (long)poVar12->_vptr_basic_ostream[-3]) = 5;
      __id._M_thread = pthread_self();
      pbVar10 = std::operator<<(poVar12,__id);
      poVar12 = std::operator<<(pbVar10,0x30);
      poVar12 = std::operator<<(poVar12,' ');
      poVar12 = std::operator<<(poVar12,this->data_->basename_);
      poVar12 = std::operator<<(poVar12,':');
      pLVar11 = (LogStream *)std::ostream::operator<<(poVar12,this->data_->line_);
      pcVar9 = "] ";
    }
    else {
      pcVar2 = *(pointer *)(LogSeverityNames + (ulong)severity * 8);
      pcVar9 = pLVar7->basename_;
      stacktrace.field_2._8_8_ = pthread_self();
      stacktrace._M_dataplus._M_p = pcVar2;
      stacktrace._M_string_length = (size_type)pcVar9;
      stacktrace.field_2._M_allocated_capacity = (size_type)&pLVar7->line_;
      (*pcVar4)(&pLVar7->stream_,&stacktrace,(anonymous_namespace)::custom_prefix_callback_data);
      pLVar11 = &this->data_->stream_;
      pcVar9 = " ";
    }
    std::operator<<(&pLVar11->super_ostream,pcVar9);
    std::ios::copyfmt((ios *)((this->data_->stream_).super_ostream._vptr_basic_ostream[-3] +
                             (long)&(this->data_->stream_).super_ostream._vptr_basic_ostream));
    std::ios_base::~ios_base((ios_base *)&saved_fmt);
    pLVar7 = this->data_;
  }
  pLVar7->num_prefix_chars_ =
       *(long *)&(pLVar7->stream_).super_ostream.field_0x30 -
       *(long *)&(pLVar7->stream_).super_ostream.field_0x28;
  if (fLS::FLAGS_log_backtrace_at_buf_abi_cxx11_._8_8_ != 0) {
    snprintf((char *)&saved_fmt,0x80,"%s:%d",pLVar7->basename_,(ulong)(uint)line);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fLS::FLAGS_log_backtrace_at_buf_abi_cxx11_,(char *)&saved_fmt);
    if (bVar5) {
      stacktrace._M_dataplus._M_p = (pointer)&stacktrace.field_2;
      stacktrace._M_string_length = 0;
      stacktrace.field_2._M_allocated_capacity =
           stacktrace.field_2._M_allocated_capacity & 0xffffffffffffff00;
      glog_internal_namespace_::DumpStackTraceToString(&stacktrace);
      poVar12 = std::operator<<(&(this->data_->stream_).super_ostream," (stacktrace:\n");
      poVar12 = std::operator<<(poVar12,(string *)&stacktrace);
      std::operator<<(poVar12,") ");
      std::__cxx11::string::~string((string *)&stacktrace);
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file, int line, LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = nullptr;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
      data_ = new (&thread_msg_data) LogMessageData;
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else   // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif  // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    std::lock_guard<std::mutex> l{fatal_msg_lock};
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = nullptr;
  data_->outvec_ = nullptr;

  const auto now = std::chrono::system_clock::now();
  time_ = LogMessageTime(now);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I20201018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT year, month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    std::ios saved_fmt(nullptr);
    saved_fmt.copyfmt(stream());
    stream().fill('0');
    if (custom_prefix_callback == nullptr) {
      stream() << LogSeverityNames[severity][0];
      if (FLAGS_log_year_in_prefix) {
        stream() << setw(4) << 1900 + time_.year();
      }
      stream() << setw(2) << 1 + time_.month() << setw(2) << time_.day() << ' '
               << setw(2) << time_.hour() << ':' << setw(2) << time_.min()
               << ':' << setw(2) << time_.sec() << "." << setw(6)
               << time_.usec() << ' ' << setfill(' ') << setw(5)
               << std::this_thread::get_id() << setfill('0') << ' '
               << data_->basename_ << ':' << data_->line_ << "] ";
    } else {
      custom_prefix_callback(
          stream(),
          LogMessageInfo(LogSeverityNames[severity], data_->basename_,
                         data_->line_, std::this_thread::get_id(), time_),
          custom_prefix_callback_data);
      stream() << " ";
    }
    stream().copyfmt(saved_fmt);
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    std::snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (FLAGS_log_backtrace_at == fileline) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}